

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_lax_polygon_layer.cc
# Opt level: O3

void __thiscall
s2builderutil::LaxPolygonLayer::AppendPolygonLoops
          (LaxPolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops,
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          *loops)

{
  pointer pvVar1;
  int *piVar2;
  VType VVar3;
  Vector3<double> *__args;
  int *piVar4;
  vector<int,_std::allocator<int>_> *__range2;
  pointer pvVar5;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_58;
  vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
  *local_38;
  
  pvVar1 = (edge_loops->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
              *)loops;
  for (pvVar5 = (edge_loops->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar5 != pvVar1; pvVar5 = pvVar5 + 1) {
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (Vector3<double> *)0x0;
    local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Vector3<double> *)0x0;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
              (&local_58,
               (long)(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    piVar2 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    for (piVar4 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
      __args = (g->vertices_->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start +
               (g->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start[*piVar4].first;
      if (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&local_58,
                   (iterator)
                   local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish,__args);
      }
      else {
        (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->c_[2] = __args->c_[2];
        VVar3 = __args->c_[1];
        (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->c_[0] = __args->c_[0];
        (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->c_[1] = VVar3;
        local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
    }
    std::
    vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
    ::emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>(local_38,&local_58)
    ;
    if (local_58.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void LaxPolygonLayer::AppendPolygonLoops(
    const Graph& g, const vector<Graph::EdgeLoop>& edge_loops,
    vector<vector<S2Point>>* loops) const {
  for (const auto& edge_loop : edge_loops) {
    vector<S2Point> vertices;
    vertices.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      vertices.push_back(g.vertex(g.edge(edge_id).first));
    }
    loops->push_back(std::move(vertices));
  }
}